

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogBegin(ImGuiLogType type,int auto_open_depth)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiContext_conflict1 *pIVar2;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled != false) {
    __assert_fail("g.LogEnabled == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2ba6,"void ImGui::LogBegin(ImGuiLogType, int)");
  }
  if (GImGui->LogFile == (ImFileHandle)0x0) {
    if ((GImGui->LogBuffer).Buf.Size < 2) {
      pIVar1 = GImGui->CurrentWindow;
      GImGui->LogEnabled = true;
      pIVar2->LogType = type;
      pIVar2->LogNextPrefix = (char *)0x0;
      pIVar2->LogNextSuffix = (char *)0x0;
      pIVar2->LogDepthRef = (pIVar1->DC).TreeDepth;
      if (auto_open_depth < 0) {
        auto_open_depth = pIVar2->LogDepthToExpandDefault;
      }
      pIVar2->LogDepthToExpand = auto_open_depth;
      pIVar2->LogLinePosY = 3.4028235e+38;
      pIVar2->LogLineFirstItem = true;
      return;
    }
    __assert_fail("g.LogBuffer.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2ba8,"void ImGui::LogBegin(ImGuiLogType, int)");
  }
  __assert_fail("g.LogFile == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x2ba7,"void ImGui::LogBegin(ImGuiLogType, int)");
}

Assistant:

void ImGui::LogBegin(ImGuiLogType type, int auto_open_depth)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.LogEnabled == false);
    IM_ASSERT(g.LogFile == NULL);
    IM_ASSERT(g.LogBuffer.empty());
    g.LogEnabled = true;
    g.LogType = type;
    g.LogNextPrefix = g.LogNextSuffix = NULL;
    g.LogDepthRef = window->DC.TreeDepth;
    g.LogDepthToExpand = ((auto_open_depth >= 0) ? auto_open_depth : g.LogDepthToExpandDefault);
    g.LogLinePosY = FLT_MAX;
    g.LogLineFirstItem = true;
}